

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall V2Transport::SetMessageToSend(V2Transport *this,CSerializedNetMsg *msg)

{
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  Span<std::byte> output;
  bool bVar1;
  _Optional_payload_base<unsigned_char> _Var2;
  V1Transport *this_00;
  uchar *puVar3;
  reference pvVar4;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var5;
  long in_RDI;
  long in_FS_OFFSET;
  Span<std::byte> aad;
  optional<unsigned_char> short_message_id;
  vector<unsigned_char,_std::allocator<unsigned_char>_> contents;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  string *in_stack_fffffffffffffec8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffed0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  uchar uVar6;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffee8;
  CSerializedNetMsg *in_stack_fffffffffffffef0;
  undefined8 in_stack_ffffffffffffff20;
  undefined1 ignore;
  iterator in_stack_ffffffffffffff28;
  bool local_79;
  Span<const_std::byte> in_stack_ffffffffffffff98;
  iterator in_stack_ffffffffffffffc0;
  undefined6 in_stack_ffffffffffffffc8;
  uchar local_30 [40];
  long local_8;
  
  ignore = (undefined1)((ulong)in_stack_ffffffffffffff20 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            ((char *)in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,
             (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),(Mutex *)0xffe578);
  this_00 = (V1Transport *)MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffffea8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffee8._M_current,
             (AnnotatedMixin<std::mutex> *)
             CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
             (char *)in_stack_fffffffffffffed8._M_current,in_stack_fffffffffffffed0._M_current,
             (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffec8 >> 0x18,0));
  if (*(char *)(in_RDI + 0x5a0) == '\x03') {
    local_79 = V1Transport::SetMessageToSend(this_00,in_stack_fffffffffffffef0);
  }
  else {
    if (*(char *)(in_RDI + 0x5a0) == '\x02') {
      bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffeb8);
      if (bVar1) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffea8);
        _Var2 = (_Optional_payload_base<unsigned_char>)
                anon_unknown.dwarf_1a76e3f::V2MessageMap::operator()
                          ((V2MessageMap *)in_stack_fffffffffffffed0._M_current,
                           in_stack_fffffffffffffec8);
        bVar1 = std::optional::operator_cast_to_bool
                          ((optional<unsigned_char> *)in_stack_fffffffffffffea8);
        if (bVar1) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffea8);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffec8,
                     CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
          puVar3 = std::optional<unsigned_char>::operator*
                             ((optional<unsigned_char> *)in_stack_fffffffffffffea8);
          uVar6 = *puVar3;
          _Var5._M_current = local_30;
          pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              in_stack_fffffffffffffeb8,(size_type)in_stack_fffffffffffffeb0);
          *pvVar4 = uVar6;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    (in_stack_fffffffffffffeb0);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffeb0)
          ;
          in_stack_ffffffffffffffc0 =
               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                         (in_stack_fffffffffffffeb0);
          __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)in_stack_fffffffffffffeb8,(difference_type)in_stack_fffffffffffffeb0);
          __last._M_current._7_1_ = uVar6;
          __last._M_current._0_7_ = in_stack_fffffffffffffee0;
          std::
          copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (_Var5,__last,in_stack_fffffffffffffed8);
        }
        else {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffea8);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffed8._M_current,
                     (size_type)in_stack_fffffffffffffed0._M_current,
                     (value_type_conflict3 *)in_stack_fffffffffffffec8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                    (in_stack_fffffffffffffea8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                    (in_stack_fffffffffffffeb8);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffea8);
          std::copy<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_char*>
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )in_stack_fffffffffffffed8._M_current,in_stack_fffffffffffffed0,
                     (uchar *)in_stack_fffffffffffffeb8);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    (in_stack_fffffffffffffeb0);
          in_stack_ffffffffffffff28 =
               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                         (in_stack_fffffffffffffeb0);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    (in_stack_fffffffffffffeb0);
          __gnu_cxx::
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)in_stack_fffffffffffffeb8,(difference_type)in_stack_fffffffffffffeb0);
          _Var5 = __gnu_cxx::
                  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               *)in_stack_fffffffffffffeb8,
                              (difference_type)in_stack_fffffffffffffeb0);
          ignore = (undefined1)((ulong)_Var5._M_current >> 0x38);
          _Var5._M_current._7_1_ = in_stack_fffffffffffffee7;
          _Var5._M_current._0_7_ = in_stack_fffffffffffffee0;
          std::
          copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (in_stack_fffffffffffffee8,_Var5,in_stack_fffffffffffffed8);
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffea8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffec8,
                   CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
        MakeByteSpan<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffeb8);
        Span<const_std::byte>::Span((Span<const_std::byte> *)in_stack_fffffffffffffea8);
        aad = MakeWritableByteSpan<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffeb8);
        in_stack_fffffffffffffea8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aad.m_data;
        __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aad.m_size;
        output.m_size._0_6_ = in_stack_ffffffffffffffc8;
        output.m_data = in_stack_ffffffffffffffc0._M_current;
        output.m_size._6_2_ = _Var2;
        BIP324Cipher::Encrypt
                  ((BIP324Cipher *)in_stack_ffffffffffffff28._M_current,in_stack_ffffffffffffff98,
                   (Span<const_std::byte>)aad,(bool)ignore,output);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (in_stack_fffffffffffffeb8,__str);
        ClearShrink<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffea8);
        local_79 = true;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffeb8);
        goto LAB_00ffe986;
      }
    }
    local_79 = false;
  }
LAB_00ffe986:
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffea8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_79;
  }
  __stack_chk_fail();
}

Assistant:

bool V2Transport::SetMessageToSend(CSerializedNetMsg& msg) noexcept
{
    AssertLockNotHeld(m_send_mutex);
    LOCK(m_send_mutex);
    if (m_send_state == SendState::V1) return m_v1_fallback.SetMessageToSend(msg);
    // We only allow adding a new message to be sent when in the READY state (so the packet cipher
    // is available) and the send buffer is empty. This limits the number of messages in the send
    // buffer to just one, and leaves the responsibility for queueing them up to the caller.
    if (!(m_send_state == SendState::READY && m_send_buffer.empty())) return false;
    // Construct contents (encoding message type + payload).
    std::vector<uint8_t> contents;
    auto short_message_id = V2_MESSAGE_MAP(msg.m_type);
    if (short_message_id) {
        contents.resize(1 + msg.data.size());
        contents[0] = *short_message_id;
        std::copy(msg.data.begin(), msg.data.end(), contents.begin() + 1);
    } else {
        // Initialize with zeroes, and then write the message type string starting at offset 1.
        // This means contents[0] and the unused positions in contents[1..13] remain 0x00.
        contents.resize(1 + CMessageHeader::COMMAND_SIZE + msg.data.size(), 0);
        std::copy(msg.m_type.begin(), msg.m_type.end(), contents.data() + 1);
        std::copy(msg.data.begin(), msg.data.end(), contents.begin() + 1 + CMessageHeader::COMMAND_SIZE);
    }
    // Construct ciphertext in send buffer.
    m_send_buffer.resize(contents.size() + BIP324Cipher::EXPANSION);
    m_cipher.Encrypt(MakeByteSpan(contents), {}, false, MakeWritableByteSpan(m_send_buffer));
    m_send_type = msg.m_type;
    // Release memory
    ClearShrink(msg.data);
    return true;
}